

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::countSubPatches
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t *numSubPatches,size_t *numSubPatchesMB,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  Scene *pSVar1;
  Geometry *pGVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  runtime_error *this_00;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  BBox1f *pBVar25;
  size_t taskCount;
  Iterator<embree::SubdivMesh,_true> iter;
  task_group_context context;
  anon_class_1_0_00000001 local_1c3;
  undefined1 local_1c2 [10];
  unsigned_long *local_1b8;
  unsigned_long local_1b0;
  Iterator<embree::GridMesh,_false> local_1a8;
  anon_class_8_1_4d25ca37_conflict local_198;
  anon_class_8_1_898bcfc2_conflict10 local_190;
  anon_class_16_2_341d598e_conflict2 local_188;
  task_group_context local_178;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  unsigned_long local_98;
  unsigned_long uStack_90;
  size_t local_88;
  size_t sStack_80;
  float local_78;
  undefined8 uStack_74;
  float fStack_6c;
  anon_class_48_6_afa08d2e_conflict2 local_60;
  
  pSVar1 = this->scene;
  local_1a8.all = false;
  sVar19 = (pSVar1->geometries).size_active;
  if (sVar19 == 0) {
    uVar22 = 0;
  }
  else {
    uVar22 = 0;
    sVar17 = 0;
    do {
      pGVar2 = (pSVar1->geometries).items[sVar17].ptr;
      if (((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 & 0x2000ff) != 0x200017)) ||
         (pGVar2->numTimeSteps == 1)) {
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)pGVar2->numPrimitives;
      }
      uVar22 = uVar22 + uVar14;
      sVar17 = sVar17 + 1;
    } while (sVar19 != sVar17);
  }
  (pstate->super_ParallelForForState).N = uVar22;
  local_1c2._2_8_ = numSubPatches;
  local_1b8 = numSubPatchesMB;
  local_1a8.scene = pSVar1;
  iVar12 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar14 = uVar22 + 0x3ff >> 10;
  if ((ulong)(long)iVar12 < uVar14) {
    uVar14 = (long)iVar12;
  }
  uVar23 = 0x40;
  if (uVar14 < 0x40) {
    uVar23 = uVar14;
  }
  uVar23 = uVar23 + (uVar23 == 0);
  (pstate->super_ParallelForForState).taskCount = uVar23;
  (pstate->super_ParallelForForState).i0[0] = 0;
  (pstate->super_ParallelForForState).j0[0] = 0;
  if (1 < uVar14) {
    uVar21 = 0;
    uVar14 = uVar22 / uVar23;
    uVar18 = 1;
    sVar19 = 0;
    do {
      pGVar2 = (pSVar1->geometries).items[sVar19].ptr;
      if (((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 & 0x2000ff) != 0x200017)) ||
         ((pGVar2->numTimeSteps == 1 || (uVar20 = (ulong)pGVar2->numPrimitives, uVar20 == 0)))) {
        uVar20 = 0;
        lVar16 = 0;
      }
      else {
        uVar15 = (uVar18 + 1) * uVar22;
        lVar16 = 0;
        uVar24 = 0;
        do {
          uVar13 = uVar14;
          uVar14 = uVar13;
          if ((uVar21 + uVar20 + lVar16 < uVar13) || (uVar23 <= uVar18)) break;
          (pstate->super_ParallelForForState).i0[uVar18] = sVar19;
          uVar24 = uVar24 + (uVar13 - uVar21);
          (pstate->super_ParallelForForState).j0[uVar18] = uVar24;
          uVar18 = uVar18 + 1;
          uVar23 = (pstate->super_ParallelForForState).taskCount;
          uVar14 = uVar15 / uVar23;
          lVar16 = -uVar24;
          uVar15 = uVar15 + uVar22;
          uVar21 = uVar13;
        } while (uVar24 < uVar20);
      }
      uVar21 = uVar20 + uVar21 + lVar16;
      sVar19 = sVar19 + 1;
    } while (uVar18 < uVar23);
  }
  local_60.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_f8;
  local_f8 = (undefined1  [8])0x7f8000007f800000;
  uStack_f0 = 0x7f8000007f800000;
  local_e8 = 0xff800000ff800000;
  uStack_e0 = 0xff800000ff800000;
  local_d8 = 0x7f8000007f800000;
  uStack_d0 = 0x7f8000007f800000;
  local_c8 = 0xff800000ff800000;
  uStack_c0 = 0xff800000ff800000;
  local_b8 = 0x7f8000007f800000;
  uStack_b0 = 0x7f8000007f800000;
  local_a8 = 0xff800000ff800000;
  uStack_a0 = 0xff800000ff800000;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_78 = 0.0;
  uStack_74 = 0x3f8000003f800000;
  fStack_6c = 0.0;
  local_198.array2 = &local_1a8;
  local_60.getSize = &local_198;
  local_188.func = (anon_class_8_1_89912a77 *)local_1c2;
  local_60.func = &local_188;
  local_60.taskCount = &local_1b0;
  local_60.reduction = &local_1c3;
  local_178._12_2_ = 0x401;
  local_178.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_178.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_178.my_name = CUSTOM_CTX;
  local_1b0 = uVar23;
  local_188.array2 = (Iterator<embree::GridMesh,_true> *)local_198.array2;
  local_60.state = pstate;
  tbb::detail::r1::initialize(&local_178);
  local_190.func = &local_60;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar23,1,&local_190,(auto_partitioner *)(local_1c2 + 1),&local_178);
  cVar11 = tbb::detail::r1::is_group_execution_cancelled(&local_178);
  if (cVar11 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_178);
  local_178.my_cpu_ctl_env = local_88;
  local_178.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)(undefined4)sStack_80;
  local_178.my_version = sStack_80._4_1_;
  local_178.my_traits = (context_traits)sStack_80._5_1_;
  local_178.my_state.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)(__atomic_base<unsigned_char>)sStack_80._6_1_;
  local_178.my_lifetime_state._M_i = sStack_80._7_1_;
  if (local_1b0 != 0) {
    pBVar25 = &(pstate->prefix_state).sums[0].max_time_range;
    fVar3 = INFINITY;
    fVar4 = INFINITY;
    uVar5 = 0x7f800000;
    uVar6 = 0x7f800000;
    fVar7 = -INFINITY;
    fVar8 = -INFINITY;
    uVar9 = 0xff800000;
    uVar10 = 0xff800000;
    do {
      (((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(pBVar25 + -0x10))->
      super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128[0] =
           (float)local_f8._0_4_;
      (((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(pBVar25 + -0x10))->
      super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128[1] =
           (float)local_f8._4_4_;
      pBVar25[-0xf].lower = (undefined4)uStack_f0;
      *(undefined4 *)((long)(pBVar25 + -0xf) + 4) = uStack_f0._4_4_;
      (((Vec3fa *)(pBVar25 + -0xe))->field_0).m128[0] = (float)local_e8;
      (((Vec3fa *)(pBVar25 + -0xe))->field_0).m128[1] = local_e8._4_4_;
      pBVar25[-0xd].lower = (undefined4)uStack_e0;
      *(undefined4 *)((long)(pBVar25 + -0xd) + 4) = uStack_e0._4_4_;
      (((BBox<embree::Vec3fa> *)(pBVar25 + -0xc))->lower).field_0.m128[0] = (float)local_d8;
      (((BBox<embree::Vec3fa> *)(pBVar25 + -0xc))->lower).field_0.m128[1] = local_d8._4_4_;
      pBVar25[-0xb].lower = (undefined4)uStack_d0;
      *(undefined4 *)((long)(pBVar25 + -0xb) + 4) = uStack_d0._4_4_;
      (((Vec3fa *)(pBVar25 + -10))->field_0).m128[0] = (float)local_c8;
      (((Vec3fa *)(pBVar25 + -10))->field_0).m128[1] = local_c8._4_4_;
      pBVar25[-9].lower = (undefined4)uStack_c0;
      *(undefined4 *)((long)(pBVar25 + -9) + 4) = uStack_c0._4_4_;
      (((BBox3fa *)(pBVar25 + -8))->lower).field_0.m128[0] = (float)local_b8;
      (((BBox3fa *)(pBVar25 + -8))->lower).field_0.m128[1] = local_b8._4_4_;
      pBVar25[-7].lower = (undefined4)uStack_b0;
      *(undefined4 *)((long)(pBVar25 + -7) + 4) = uStack_b0._4_4_;
      (((Vec3fa *)(pBVar25 + -6))->field_0).m128[0] = (float)local_a8;
      (((Vec3fa *)(pBVar25 + -6))->field_0).m128[1] = local_a8._4_4_;
      pBVar25[-5].lower = (undefined4)uStack_a0;
      *(undefined4 *)((long)(pBVar25 + -5) + 4) = uStack_a0._4_4_;
      ((range<unsigned_long> *)(pBVar25 + -4))->_begin = local_98;
      pBVar25[-3] = (BBox1f)uStack_90;
      pBVar25[-2] = (BBox1f)local_178.my_cpu_ctl_env;
      pBVar25[-1] = (BBox1f)local_178._8_8_;
      pBVar25->lower = local_78;
      pBVar25->upper = (float)uStack_74;
      pBVar25[1].lower = uStack_74._4_4_;
      pBVar25[1].upper = fStack_6c;
      local_98 = local_98 + *(long *)(pBVar25 + -0x484);
      uStack_90 = uStack_90 + *(long *)(pBVar25 + -0x483);
      local_178.my_cpu_ctl_env = 0;
      local_178.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)0x0;
      local_178.my_version = gold_2021U1;
      local_178.my_traits = (context_traits)0x0;
      local_178.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x0
      ;
      local_178.my_lifetime_state._M_i = created;
      pBVar25 = pBVar25 + 0x12;
      local_1b0 = local_1b0 - 1;
      local_f8._0_4_ = fVar3;
      local_f8._4_4_ = fVar4;
      uStack_f0._0_4_ = uVar5;
      uStack_f0._4_4_ = uVar6;
      local_e8._0_4_ = fVar7;
      local_e8._4_4_ = fVar8;
      uStack_e0._0_4_ = uVar9;
      uStack_e0._4_4_ = uVar10;
      local_d8._0_4_ = fVar3;
      local_d8._4_4_ = fVar4;
      uStack_d0._0_4_ = uVar5;
      uStack_d0._4_4_ = uVar6;
      local_c8._0_4_ = fVar7;
      local_c8._4_4_ = fVar8;
      uStack_c0._0_4_ = uVar9;
      uStack_c0._4_4_ = uVar10;
      local_b8._0_4_ = fVar3;
      local_b8._4_4_ = fVar4;
      uStack_b0._0_4_ = uVar5;
      uStack_b0._4_4_ = uVar6;
      local_a8._0_4_ = fVar7;
      local_a8._4_4_ = fVar8;
      uStack_a0._0_4_ = uVar9;
      uStack_a0._4_4_ = uVar10;
      local_78 = 0.0;
      uStack_74._0_4_ = 1.0;
      uStack_74._4_4_ = 1.0;
      fStack_6c = 0.0;
    } while (local_1b0 != 0);
  }
  *(unsigned_long *)local_1c2._2_8_ = local_98;
  *local_1b8 = uStack_90;
  return;
}

Assistant:

void countSubPatches(size_t& numSubPatches, size_t& numSubPatchesMB, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        Scene::Iterator<SubdivMesh,true> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB
        { 
          size_t s = 0;
          size_t sMB = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {          
            if (!mesh->valid(f)) continue;
            size_t count = patch_eval_subdivision_count(mesh->getHalfEdge(0,f));
            s += count;
            sMB += count * mesh->numTimeSteps;
          }
          return PrimInfoMB(s,sMB);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB(a.begin()+b.begin(),a.end()+b.end()); });

        numSubPatches = pinfo.begin();
        numSubPatchesMB = pinfo.end();
      }